

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder * __thiscall
capnp::_::OrphanBuilder::referenceExternalData
          (OrphanBuilder *__return_storage_ptr__,OrphanBuilder *this,BuilderArena *arena,Reader data
          )

{
  ArrayPtr<const_capnp::word> content;
  uint uVar1;
  uchar *puVar2;
  size_t i;
  unsigned_long uVar3;
  word *pwVar4;
  WirePointer *pWVar5;
  SegmentBuilder *pSVar6;
  undefined1 auStack_60 [8];
  ArrayPtr<const_capnp::word> words;
  WordCount wordCount;
  unsigned_long checkedSize;
  Fault local_30;
  Fault f;
  BuilderArena *arena_local;
  Reader data_local;
  OrphanBuilder *result;
  
  data_local.super_ArrayPtr<const_unsigned_char>.ptr = data.super_ArrayPtr<const_unsigned_char>.ptr;
  f.exception = (Exception *)this;
  arena_local = arena;
  data_local.super_ArrayPtr<const_unsigned_char>.size_ = (size_t)__return_storage_ptr__;
  puVar2 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&arena_local);
  if (((ulong)puVar2 & 7) != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xdb3,FAILED,"reinterpret_cast<uintptr_t>(data.begin()) % sizeof(void*) == 0",
               "\"Cannot referenceExternalData() that is not aligned.\"",
               (char (*) [52])"Cannot referenceExternalData() that is not aligned.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  i = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&arena_local);
  uVar3 = bounded<unsigned_long>(i);
  uVar3 = assertMaxBits<29u,unsigned_long,kj::ThrowOverflow>
                    (uVar3,(ThrowOverflow *)((long)&words.size_ + 7));
  wordCount = (WordCount)uVar3;
  words.size_._0_4_ = WireHelpers::roundBytesUpToWords(wordCount);
  pwVar4 = (word *)kj::ArrayPtr<const_unsigned_char>::begin
                             ((ArrayPtr<const_unsigned_char> *)&arena_local);
  uVar1 = unbound<unsigned_int>((WordCount)words.size_);
  kj::ArrayPtr<const_capnp::word>::ArrayPtr
            ((ArrayPtr<const_capnp::word> *)auStack_60,pwVar4,(ulong)uVar1);
  OrphanBuilder(__return_storage_ptr__);
  pWVar5 = tagAsPtr(__return_storage_ptr__);
  WirePointer::setKindForOrphan(pWVar5,LIST);
  pWVar5 = tagAsPtr(__return_storage_ptr__);
  WirePointer::ListRef::set(&(pWVar5->field_1).listRef,BYTE,wordCount);
  content.size_ = (size_t)words.ptr;
  content.ptr = (word *)auStack_60;
  pSVar6 = BuilderArena::addExternalSegment((BuilderArena *)f.exception,content);
  __return_storage_ptr__->segment = pSVar6;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  pwVar4 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)auStack_60);
  __return_storage_ptr__->location = pwVar4;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::referenceExternalData(BuilderArena* arena, Data::Reader data) {
  // TODO(someday): We now allow unaligned segments on architectures thata support it. We could
  //   consider relaxing this check as well?
  KJ_REQUIRE(reinterpret_cast<uintptr_t>(data.begin()) % sizeof(void*) == 0,
             "Cannot referenceExternalData() that is not aligned.");

  auto checkedSize = assertMaxBits<BLOB_SIZE_BITS>(bounded(data.size()));
  auto wordCount = WireHelpers::roundBytesUpToWords(checkedSize * BYTES);
  kj::ArrayPtr<const word> words(reinterpret_cast<const word*>(data.begin()),
                                 unbound(wordCount / WORDS));

  OrphanBuilder result;
  result.tagAsPtr()->setKindForOrphan(WirePointer::LIST);
  result.tagAsPtr()->listRef.set(ElementSize::BYTE, checkedSize * ELEMENTS);
  result.segment = arena->addExternalSegment(words);

  // External data cannot possibly contain capabilities.
  result.capTable = nullptr;

  // const_cast OK here because we will check whether the segment is writable when we try to get
  // a builder.
  result.location = const_cast<word*>(words.begin());

  return result;
}